

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void cmDocumentation::WarnFormFromFilename(RequestedHelpItem *request,bool *result)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  string local_58;
  undefined1 local_38 [8];
  string ext;
  bool *result_local;
  RequestedHelpItem *request_local;
  
  ext.field_2._8_8_ = result;
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_38,&request->Filename);
  cmsys::SystemTools::UpperCase(&local_58,(string *)local_38);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,".HTM");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,".HTML"), bVar1)) {
    request->HelpType = None;
    *(undefined1 *)ext.field_2._8_8_ = 1;
    cmSystemTools::Message("Warning: HTML help format no longer supported",(char *)0x0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,".DOCBOOK");
    if (bVar1) {
      request->HelpType = None;
      *(undefined1 *)ext.field_2._8_8_ = 1;
      cmSystemTools::Message("Warning: Docbook help format no longer supported",(char *)0x0);
    }
    else {
      lVar2 = std::__cxx11::string::length();
      if (((lVar2 == 2) &&
          (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38), '0' < *pcVar3)) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38), *pcVar3 < ':')) {
        request->HelpType = None;
        *(undefined1 *)ext.field_2._8_8_ = 1;
        cmSystemTools::Message("Warning: Man help format no longer supported",(char *)0x0);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmDocumentation::WarnFormFromFilename(
  cmDocumentation::RequestedHelpItem& request, bool& result)
{
  std::string ext = cmSystemTools::GetFilenameLastExtension(request.Filename);
  ext = cmSystemTools::UpperCase(ext);
  if ((ext == ".HTM") || (ext == ".HTML"))
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: HTML help format no longer supported");
    }
  else if (ext == ".DOCBOOK")
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Docbook help format no longer supported");
    }
  // ".1" to ".9" should be manpages
  else if ((ext.length()==2) && (ext[1] >='1') && (ext[1]<='9'))
    {
    request.HelpType = cmDocumentation::None;
    result = true;
    cmSystemTools::Message("Warning: Man help format no longer supported");
    }
}